

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDriverGetExtensionFunctionAddress
          (ze_driver_handle_t hDriver,char *name,void **ppFunctionAddress)

{
  ze_pfnDriverGetExtensionFunctionAddress_t pfnGetExtensionFunctionAddress;
  ze_result_t result;
  void **ppFunctionAddress_local;
  char *name_local;
  ze_driver_handle_t hDriver_local;
  
  pfnGetExtensionFunctionAddress._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c1f8 != (code *)0x0) {
    pfnGetExtensionFunctionAddress._4_4_ = (*DAT_0011c1f8)(hDriver,name,ppFunctionAddress);
  }
  return pfnGetExtensionFunctionAddress._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetExtensionFunctionAddress(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        const char* name,                               ///< [in] extension function name
        void** ppFunctionAddress                        ///< [out] pointer to function pointer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetExtensionFunctionAddress = context.zeDdiTable.Driver.pfnGetExtensionFunctionAddress;
        if( nullptr != pfnGetExtensionFunctionAddress )
        {
            result = pfnGetExtensionFunctionAddress( hDriver, name, ppFunctionAddress );
        }
        else
        {
            // generic implementation
        }

        return result;
    }